

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
soplex::Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::Array
          (Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *this,
          Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *old)

{
  vector<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
  *in_stack_00000078;
  vector<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
  *in_stack_00000080;
  
  std::
  vector<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
  ::vector((vector<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
            *)0x2b1f9c);
  std::
  vector<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
  ::operator=(in_stack_00000080,in_stack_00000078);
  return;
}

Assistant:

Array(const Array& old)
   {
      data = old.data;
   }